

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

char * promptsep(char *buf,int num_post_attribs)

{
  char *conj;
  int num_post_attribs_local;
  char *buf_local;
  
  if (((1 < num_post_attribs) && (post_attribs < num_post_attribs)) && ('\x01' < post_attribs)) {
    strcat(buf,",");
  }
  strcat(buf," ");
  post_attribs = post_attribs + -1;
  if ((post_attribs == '\0') && (1 < num_post_attribs)) {
    strcat(buf,"and ");
  }
  return buf;
}

Assistant:

static char *promptsep(char *buf, int num_post_attribs)
{
	const char *conj = "and ";
	if (num_post_attribs > 1
	    && post_attribs < num_post_attribs && post_attribs > 1)
		strcat(buf, ",");
	strcat(buf, " ");
	--post_attribs;
	if (!post_attribs && num_post_attribs > 1) strcat(buf, conj);
	return buf;
}